

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O3

void __thiscall jrtplib::RTPUDPv4Transmitter::~RTPUDPv4Transmitter(RTPUDPv4Transmitter *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPUDPv4Transmitter_001441a0;
  Destroy(this);
  RTPAbortDescriptors::~RTPAbortDescriptors(&this->m_abortDesc);
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
  ::~RTPKeyHashTable(&this->acceptignoreinfo);
  p_Var2 = (this->rawpacketlist).
           super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->rawpacketlist) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::
  ~RTPHashTable(&this->multicastgroups);
  RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
  ::~RTPHashTable(&this->destinations);
  p_Var2 = (this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->localIPs) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  return;
}

Assistant:

RTPUDPv4Transmitter::~RTPUDPv4Transmitter()
{
	Destroy();
}